

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
genRandom(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int num_samples,
         int num_dimensions)

{
  pointer pdVar1;
  vector<double,_std::allocator<double>_> *__range1;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double *v;
  pointer pdVar2;
  double dVar3;
  allocator_type local_21;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)num_dimensions * (long)num_samples,&local_21);
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    dVar3 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                      (&park_miller);
    *pdVar2 = dVar3 + dVar3 + -1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> genRandom(int num_samples, int num_dimensions = 1){
    std::vector<double> x(Utils::size_mult(num_samples, num_dimensions));
    std::uniform_real_distribution<double> unif(-1.0, 1.0);
    for(auto &v : x) v = unif(park_miller);
    return x;
}